

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEditPrivate::updateEditFieldGeometry(QDateTimeEditPrivate *this)

{
  long lVar1;
  bool bVar2;
  QWidget *widget;
  QStyle *pQVar3;
  undefined4 extraout_var;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEdit *q;
  QStyleOptionComboBox optCombo;
  undefined4 in_stack_ffffffffffffff28;
  SubControl in_stack_ffffffffffffff2c;
  QFlags<QStyle::SubControl> *in_stack_ffffffffffffff30;
  QStyleOptionComboBox *this_00;
  QDateTimeEditPrivate *in_stack_ffffffffffffff40;
  QDateTimeEditPrivate *this_01;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff64;
  QWidget *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = calendarPopupEnabled(in_stack_ffffffffffffff40);
  if (bVar2) {
    widget = (QWidget *)q_func(in_RDI);
    memset(&stack0xffffffffffffff68,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x561e90);
    QStyleOption::initFrom((QStyleOption *)this_01,widget);
    QFlags<QStyle::SubControl>::QFlags(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    this_00 = (QStyleOptionComboBox *)(in_RDI->super_QAbstractSpinBoxPrivate).edit;
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,1,&stack0xffffffffffffff68,2,widget);
    QWidget::setGeometry
              (in_stack_ffffffffffffff68,(QRect *)CONCAT44(in_stack_ffffffffffffff64,extraout_var));
    QStyleOptionComboBox::~QStyleOptionComboBox(this_00);
  }
  else {
    QAbstractSpinBoxPrivate::updateEditFieldGeometry
              ((QAbstractSpinBoxPrivate *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateEditFieldGeometry()
{
    if (!calendarPopupEnabled()) {
        QAbstractSpinBoxPrivate::updateEditFieldGeometry();
        return;
    }

    Q_Q(QDateTimeEdit);

    QStyleOptionComboBox optCombo;
    optCombo.initFrom(q);
    optCombo.editable = true;
    optCombo.subControls = QStyle::SC_ComboBoxEditField;
    edit->setGeometry(q->style()->subControlRect(QStyle::CC_ComboBox, &optCombo,
                                                 QStyle::SC_ComboBoxEditField, q));
}